

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
::dx(FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  Fad<double> *pFVar3;
  double *pdVar4;
  value_type vVar5;
  value_type vVar6;
  value_type vVar7;
  value_type vVar8;
  
  pFVar3 = this->left_;
  pdVar4 = &pFVar3->defaultVal;
  if ((pFVar3->dx_).num_elts != 0) {
    pdVar4 = (pFVar3->dx_).ptr_to_data + i;
  }
  dVar1 = *pdVar4;
  vVar5 = FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>::val
                    (&this->right_->fadexpr_);
  vVar6 = FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>::dx
                    (&this->right_->fadexpr_,i);
  dVar2 = this->left_->val_;
  vVar7 = FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>::val
                    (&this->right_->fadexpr_);
  vVar8 = FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>::val
                    (&this->right_->fadexpr_);
  return (vVar5 * dVar1 - vVar6 * dVar2) / (vVar8 * vVar7);
}

Assistant:

const value_type dx(int i) const {return  (left_.dx(i) * right_.val() - right_.dx(i) * left_.val() ) / (right_.val() * right_.val()) ;}